

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::ComputeCompileFeatures
          (cmGeneratorTarget *this,string *config,
          set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *languagePairs)

{
  cmMakefile *this_00;
  bool bVar1;
  reference lang;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar2;
  mapped_type *pmVar3;
  string *psVar4;
  cmListFileBacktrace local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1c0;
  cmAlphaNum local_188;
  cmAlphaNum local_158;
  string local_128;
  cmValue local_108;
  cmValue defaultStandard;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *standardToCopy;
  string local_b8;
  cmAlphaNum local_98;
  undefined1 local_68 [8];
  string key;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *generatorTargetLanguageStandard;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *language;
  iterator __end1;
  iterator __begin1;
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *languagePairs_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  __end1 = std::
           set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(languagePairs);
  language = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::
                set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end(languagePairs);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&language), bVar1) {
    lang = std::
           _Rb_tree_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*(&__end1);
    key.field_2._8_8_ = GetLanguageStandardProperty(this,&lang->first,config);
    if ((BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        key.field_2._8_8_ ==
        (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
       ) {
      cmsys::SystemTools::UpperCase(&local_b8,config);
      cmAlphaNum::cmAlphaNum(&local_98,&local_b8);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&standardToCopy,'-');
      cmStrCat<std::__cxx11::string>
                ((string *)local_68,&local_98,(cmAlphaNum *)&standardToCopy,&lang->first);
      std::__cxx11::string::~string((string *)&local_b8);
      pBVar2 = GetLanguageStandardProperty(this,&lang->second,config);
      defaultStandard.Value = &pBVar2->Value;
      if (pBVar2 == (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0) {
        this_00 = this->Makefile;
        cmAlphaNum::cmAlphaNum(&local_158,"CMAKE_");
        cmAlphaNum::cmAlphaNum(&local_188,&lang->second);
        cmStrCat<char[18]>(&local_128,&local_158,&local_188,(char (*) [18])"_STANDARD_DEFAULT");
        local_108 = cmMakefile::GetDefinition(this_00,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        bVar1 = cmValue::operator_cast_to_bool(&local_108);
        if (bVar1) {
          psVar4 = cmValue::operator*[abi_cxx11_(&local_108);
          std::__cxx11::string::string((string *)&local_1e0,(string *)psVar4);
          local_1f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_1f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          cmListFileBacktrace::cmListFileBacktrace(&local_1f8);
          BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BTs
                    (&local_1c0,&local_1e0,&local_1f8);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->LanguageStandardMap,(key_type *)local_68);
          BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator=(pmVar3,&local_1c0);
          BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          ~BTs(&local_1c0);
          cmListFileBacktrace::~cmListFileBacktrace(&local_1f8);
          std::__cxx11::string::~string((string *)&local_1e0);
          key.field_2._8_8_ =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&this->LanguageStandardMap,(key_type *)local_68);
        }
      }
      else {
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&this->LanguageStandardMap,(key_type *)local_68);
        BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator=(pmVar3,pBVar2);
        key.field_2._8_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&this->LanguageStandardMap,(key_type *)local_68);
      }
      if (((key.field_2._8_8_ != 0) && (bVar1 = std::operator==(&lang->first,"CUDA"), bVar1)) &&
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)key.field_2._8_8_,"98"), bVar1)) {
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&this->LanguageStandardMap,(key_type *)local_68);
        std::__cxx11::string::operator=((string *)pmVar3,"03");
      }
      std::__cxx11::string::~string((string *)local_68);
    }
    std::
    _Rb_tree_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool cmGeneratorTarget::ComputeCompileFeatures(
  std::string const& config, std::set<LanguagePair> const& languagePairs) const
{
  for (const auto& language : languagePairs) {
    BTs<std::string> const* generatorTargetLanguageStandard =
      this->GetLanguageStandardProperty(language.first, config);
    if (!generatorTargetLanguageStandard) {
      // If the standard isn't explicitly set we copy it over from the
      // specified paired language.
      std::string key =
        cmStrCat(cmSystemTools::UpperCase(config), '-', language.first);
      BTs<std::string> const* standardToCopy =
        this->GetLanguageStandardProperty(language.second, config);
      if (standardToCopy) {
        this->LanguageStandardMap[key] = *standardToCopy;
        generatorTargetLanguageStandard = &this->LanguageStandardMap[key];
      } else {
        cmValue defaultStandard = this->Makefile->GetDefinition(
          cmStrCat("CMAKE_", language.second, "_STANDARD_DEFAULT"));
        if (defaultStandard) {
          this->LanguageStandardMap[key] = BTs<std::string>(*defaultStandard);
          generatorTargetLanguageStandard = &this->LanguageStandardMap[key];
        }
      }

      // Custom updates for the CUDA standard.
      if (generatorTargetLanguageStandard != nullptr &&
          (language.first == "CUDA")) {
        if (generatorTargetLanguageStandard->Value == "98") {
          this->LanguageStandardMap[key].Value = "03";
        }
      }
    }
  }

  return true;
}